

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_Date_UTC(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  anon_union_8_2_94730072 u;
  double dVar8;
  JSValue JVar9;
  JSValue val;
  double a;
  double fields [7];
  
  JVar2.float64 = NAN;
  fields[4] = 0.0;
  fields[5] = 0.0;
  fields[0] = 0.0;
  fields[1] = 0.0;
  fields[6] = 0.0;
  fields._16_16_ = ZEXT816(0x3ff0000000000000);
  uVar4 = 7;
  if (argc != 0) {
    uVar5 = 7;
    if (argc < 7) {
      uVar5 = argc;
    }
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    for (lVar7 = 0; (ulong)uVar5 * 8 != lVar7; lVar7 = lVar7 + 8) {
      val.tag = *(int64_t *)((long)&argv->tag + lVar7 * 2);
      val.u.ptr = ((JSValueUnion *)((long)&argv->u + lVar7 * 2))->ptr;
      iVar1 = JS_ToFloat64(ctx,&a,val);
      if (iVar1 != 0) {
        JVar2.float64 = 0.0;
        uVar4 = 6;
        goto LAB_0014082f;
      }
      if (0x7fefffffffffffff < (ulong)ABS(a)) {
        uVar4 = 7;
        JVar2.float64 = NAN;
        goto LAB_0014082f;
      }
      dVar8 = trunc(a);
      *(double *)((long)fields + lVar7) = dVar8;
      if (((lVar7 == 0) && (0.0 <= fields[0])) && (fields[0] < 100.0)) {
        fields[0] = fields[0] + 1900.0;
      }
    }
    dVar8 = set_date_fields(fields,0);
    uVar3 = (ulong)dVar8 & 0xffffffff;
    uVar6 = (ulong)dVar8 & 0xffffffff00000000;
    if (dVar8 == (double)(int)dVar8) {
      uVar3 = (ulong)(uint)(int)dVar8;
      uVar6 = 0;
    }
    uVar4 = 7;
    if (dVar8 == (double)(int)dVar8) {
      uVar4 = 0;
    }
    JVar2.ptr = (void *)(uVar3 | uVar6);
  }
LAB_0014082f:
  JVar9.tag = uVar4;
  JVar9.u.float64 = JVar2.float64;
  return JVar9;
}

Assistant:

static JSValue js_Date_UTC(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    // UTC(y, mon, d, h, m, s, ms)
    double fields[] = { 0, 0, 1, 0, 0, 0, 0 };
    int i, n;
    double a;

    n = argc;
    if (n == 0)
        return JS_NAN;
    if (n > 7)
        n = 7;
    for(i = 0; i < n; i++) {
        if (JS_ToFloat64(ctx, &a, argv[i]))
            return JS_EXCEPTION;
        if (!isfinite(a))
            return JS_NAN;
        fields[i] = trunc(a);
        if (i == 0 && fields[0] >= 0 && fields[0] < 100)
            fields[0] += 1900;
    }
    return JS_NewFloat64(ctx, set_date_fields(fields, 0));
}